

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O2

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  pointer pcVar1;
  MessageType MVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  allocator local_21d;
  MessageType messageType;
  cmMakefile *local_218;
  cmMakefile *local_210;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  string err;
  cmCommandContext local_188;
  cmListFileContext conditionContext;
  cmListFileContext execContext;
  cmConditionEvaluator conditionEvaluator;
  
  iVar4 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"while");
  if (iVar4 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar4 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endwhile");
    if (iVar4 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&conditionEvaluator,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        if (conditionEvaluator.Makefile == (cmMakefile *)0x0) {
          return false;
        }
        errorString._M_dataplus._M_p = (pointer)&errorString.field_2;
        errorString._M_string_length = 0;
        errorString.field_2._M_local_buf[0] = '\0';
        expandedArguments.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expandedArguments.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        expandedArguments.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_210 = conditionEvaluator.Makefile;
        cmMakefile::ExpandArguments(mf,&this->Args,&expandedArguments,(char *)0x0);
        cmListFileContext::cmListFileContext
                  (&execContext,&(this->super_cmFunctionBlocker).StartingContext);
        local_188.Name._M_dataplus._M_p = (pointer)&local_188.Name.field_2;
        local_188.Name._M_string_length = 0;
        local_188.Name.field_2._M_local_buf[0] = '\0';
        local_188.Line = execContext.Line;
        std::__cxx11::string::_M_assign((string *)&local_188);
        cmConditionEvaluator::GetConditionContext
                  (&conditionContext,mf,&local_188,
                   &(this->super_cmFunctionBlocker).StartingContext.FilePath);
        cmMakefile::GetBacktrace((cmListFileBacktrace *)&err,mf,&local_188);
        cmConditionEvaluator::cmConditionEvaluator
                  (&conditionEvaluator,mf,&conditionContext,(cmListFileBacktrace *)&err);
        local_218 = mf;
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&err);
        bVar3 = cmConditionEvaluator::IsTrue
                          (&conditionEvaluator,&expandedArguments,&errorString,&messageType);
        do {
          if (bVar3 == false) {
LAB_002b8644:
            cmConditionEvaluator::~cmConditionEvaluator(&conditionEvaluator);
            cmListFileContext::~cmListFileContext(&conditionContext);
            std::__cxx11::string::~string((string *)&local_188);
            cmListFileContext::~cmListFileContext(&execContext);
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector(&expandedArguments);
            std::__cxx11::string::~string((string *)&errorString);
            (**(code **)(*(long *)&(local_210->CMP0054ReportedIds)._M_t._M_impl + 0x18))();
            return true;
          }
          if (errorString._M_string_length != 0) {
            std::__cxx11::string::string((string *)&err,"had incorrect arguments: ",&local_21d);
            for (uVar5 = 0;
                (ulong)uVar5 <
                (ulong)(((long)(this->Args).
                               super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Args).
                              super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar5 = uVar5 + 1)
            {
              std::__cxx11::string::append((char *)&err);
              std::__cxx11::string::append((string *)&err);
              std::__cxx11::string::append((char *)&err);
              std::__cxx11::string::append((char *)&err);
            }
            std::__cxx11::string::append((char *)&err);
            std::__cxx11::string::append((string *)&err);
            std::__cxx11::string::append((char *)&err);
            MVar2 = messageType;
            cmMakefile::IssueMessage(local_218,messageType,&err,false);
            if (MVar2 == FATAL_ERROR) {
              cmSystemTools::s_FatalErrorOccured = true;
              std::__cxx11::string::~string((string *)&err);
              goto LAB_002b8644;
            }
            std::__cxx11::string::~string((string *)&err);
          }
          uVar5 = 0;
          while( true ) {
            pcVar1 = (this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->Functions).
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 6) <=
                (ulong)uVar5) break;
            err._M_dataplus._M_p._0_4_ = 0;
            cmMakefile::ExecuteCommand(local_218,pcVar1 + uVar5,(cmExecutionStatus *)&err);
            if ((char)err._M_dataplus._M_p == '\x01') {
              inStatus->ReturnInvoked = true;
              goto LAB_002b8644;
            }
            if (err._M_dataplus._M_p._1_1_ != '\0') goto LAB_002b8644;
            if (err._M_dataplus._M_p._2_1_ != '\0') break;
            bVar3 = cmSystemTools::GetFatalErrorOccured();
            uVar5 = uVar5 + 1;
            if (bVar3) goto LAB_002b8644;
          }
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::clear
                    (&expandedArguments);
          cmMakefile::ExpandArguments(local_218,&this->Args,&expandedArguments,(char *)0x0);
          bVar3 = cmConditionEvaluator::IsTrue
                            (&conditionEvaluator,&expandedArguments,&errorString,&messageType);
        } while( true );
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmWhileFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // at end of for each execute recorded commands
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"while"))
    {
    // record the number of while commands past this one
    this->Depth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endwhile"))
    {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      cmake::MessageType messageType;

      cmListFileContext execContext = this->GetStartingContext();

      cmCommandContext commandContext;
      commandContext.Line = execContext.Line;
      commandContext.Name = execContext.Name;

      cmListFileContext conditionContext =
          cmConditionEvaluator::GetConditionContext(
            &mf, commandContext,
            this->GetStartingContext().FilePath);

      cmConditionEvaluator conditionEvaluator(
            mf, conditionContext,
            mf.GetBacktrace(commandContext));

      bool isTrue = conditionEvaluator.IsTrue(
        expandedArguments, errorString, messageType);

      while (isTrue)
        {
        if (!errorString.empty())
          {
          std::string err = "had incorrect arguments: ";
          unsigned int i;
          for(i =0; i < this->Args.size(); ++i)
            {
            err += (this->Args[i].Delim?"\"":"");
            err += this->Args[i].Value;
            err += (this->Args[i].Delim?"\"":"");
            err += " ";
            }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == cmake::FATAL_ERROR)
            {
            cmSystemTools::SetFatalErrorOccured();
            return true;
            }
          }

        // Invoke all the functions that were collected in the block.
        for(unsigned int c = 0; c < this->Functions.size(); ++c)
          {
          cmExecutionStatus status;
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            return true;
            }
          if (status.GetContinueInvoked())
            {
            break;
            }
          if(cmSystemTools::GetFatalErrorOccured() )
            {
            return true;
            }
          }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(
          expandedArguments, errorString, messageType);
        }
      return true;
      }
    else
      {
      // decrement for each nested while that ends
      this->Depth--;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}